

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O2

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  Contrib_List *pCVar1;
  ushort uVar2;
  int iVar3;
  float fVar4;
  int iVar5;
  Contrib_List *p;
  Contrib_List *pCVar6;
  Contrib *p_00;
  uint uVar7;
  ulong uVar8;
  Contrib_List *pCVar9;
  int iVar10;
  uint uVar11;
  Contrib_List *pCVar12;
  int iVar13;
  ulong uVar14;
  undefined8 *puVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Resample_Real RVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Contrib *local_78;
  Contrib *local_68;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar6 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar9 = (Contrib_List *)0x0;
  pCVar12 = p;
  if (pCVar6 == (Contrib_List *)0x0) goto LAB_0014214a;
  fVar22 = 1.0 / filter_scale;
  fVar23 = (float)dst_x / (float)src_x;
  pCVar9 = p;
  pCVar12 = pCVar6;
  if (1.0 <= fVar23) {
    uVar8 = 0;
    uVar14 = (ulong)(uint)dst_x;
    if (dst_x < 1) {
      uVar14 = uVar8;
    }
    puVar15 = (undefined8 *)&pCVar6->field_0x4;
    iVar13 = 0;
    for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
      fVar16 = ((float)(int)uVar8 + 0.5) / fVar23 + -0.5 + src_ofs;
      fVar17 = floorf(fVar16 - filter_support * filter_scale);
      fVar18 = ceilf(filter_support * filter_scale + fVar16);
      *(float *)((long)puVar15 + -4) = fVar16;
      *puVar15 = CONCAT44((int)fVar18,(int)fVar17);
      iVar13 = (iVar13 - (int)fVar17) + (int)fVar18 + 1;
      puVar15 = (undefined8 *)((long)puVar15 + 0xc);
    }
    if ((iVar13 != 0) &&
       (p_00 = (Contrib *)crnlib_calloc((long)iVar13,8,(size_t *)0x0), p_00 != (Contrib *)0x0)) {
      local_68 = p_00;
      for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
        fVar23 = *(float *)(&pCVar6->n + uVar8 * 6);
        iVar13 = *(int *)(&pCVar6->field_0x4 + uVar8 * 0xc);
        iVar3 = *(int *)((long)&pCVar6->p + uVar8 * 0xc);
        p[uVar8].n = 0;
        pCVar1 = p + uVar8;
        p[uVar8].p = local_68;
        iVar5 = iVar3 - iVar13;
        fVar16 = 0.0;
        for (iVar10 = iVar13; iVar10 <= iVar3; iVar10 = iVar10 + 1) {
          RVar20 = (*Pfilter)((fVar23 - (float)iVar10) * fVar22);
          fVar16 = fVar16 + RVar20;
        }
        fVar18 = 0.0;
        fVar17 = -1e+20;
        uVar11 = 0xffffffff;
        for (; iVar13 <= iVar3; iVar13 = iVar13 + 1) {
          RVar20 = (*Pfilter)((fVar23 - (float)iVar13) * fVar22);
          fVar19 = RVar20 * (1.0 / fVar16);
          if ((fVar19 != 0.0) || (fVar21 = fVar17, uVar7 = uVar11, NAN(fVar19))) {
            iVar10 = reflect(iVar13,src_x,boundary_op);
            uVar2 = pCVar1->n;
            pCVar1->n = uVar2 + 1;
            *(short *)((long)&pCVar1->p->pixel + (ulong)((uint)uVar2 * 8)) = (short)iVar10;
            *(float *)((long)&pCVar1->p->weight + (ulong)((uint)uVar2 * 8)) = fVar19;
            fVar18 = fVar18 + fVar19;
            fVar21 = fVar19;
            uVar7 = (uint)uVar2;
            if (fVar19 <= fVar17) {
              fVar21 = fVar17;
              uVar7 = uVar11;
            }
          }
          fVar17 = fVar21;
          uVar11 = uVar7;
        }
        if ((uVar11 == 0xffffffff) || (pCVar1->n == 0)) goto LAB_00142134;
        if ((fVar18 != 1.0) || (NAN(fVar18))) {
          pCVar1->p[uVar11].weight = (1.0 - fVar18) + pCVar1->p[uVar11].weight;
        }
        local_68 = local_68 + (iVar5 + 1);
      }
      goto LAB_0014214a;
    }
  }
  else {
    fVar16 = (filter_support / fVar23) * filter_scale;
    uVar8 = 0;
    uVar14 = (ulong)(uint)dst_x;
    if (dst_x < 1) {
      uVar14 = uVar8;
    }
    puVar15 = (undefined8 *)&pCVar6->field_0x4;
    iVar13 = 0;
    for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
      fVar17 = ((float)(int)uVar8 + 0.5) / fVar23 + -0.5 + src_ofs;
      fVar18 = floorf(fVar17 - fVar16);
      fVar19 = ceilf(fVar16 + fVar17);
      *(float *)((long)puVar15 + -4) = fVar17;
      *puVar15 = CONCAT44((int)fVar19,(int)fVar18);
      iVar13 = (iVar13 - (int)fVar18) + (int)fVar19 + 1;
      puVar15 = (undefined8 *)((long)puVar15 + 0xc);
    }
    if ((iVar13 != 0) &&
       (p_00 = (Contrib *)crnlib_calloc((long)iVar13,8,(size_t *)0x0), p_00 != (Contrib *)0x0)) {
      local_78 = p_00;
      for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
        fVar16 = *(float *)(&pCVar6->n + uVar8 * 6);
        iVar13 = *(int *)(&pCVar6->field_0x4 + uVar8 * 0xc);
        iVar3 = *(int *)((long)&pCVar6->p + uVar8 * 0xc);
        p[uVar8].n = 0;
        pCVar1 = p + uVar8;
        p[uVar8].p = local_78;
        iVar5 = iVar3 - iVar13;
        fVar17 = 0.0;
        for (iVar10 = iVar13; iVar10 <= iVar3; iVar10 = iVar10 + 1) {
          RVar20 = (*Pfilter)((fVar16 - (float)iVar10) * fVar23 * fVar22);
          fVar17 = fVar17 + RVar20;
        }
        fVar19 = 0.0;
        fVar18 = -1e+20;
        uVar11 = 0xffffffff;
        for (; iVar13 <= iVar3; iVar13 = iVar13 + 1) {
          RVar20 = (*Pfilter)((fVar16 - (float)iVar13) * fVar23 * fVar22);
          fVar21 = RVar20 * (1.0 / fVar17);
          if ((fVar21 != 0.0) || (fVar4 = fVar18, uVar7 = uVar11, NAN(fVar21))) {
            iVar10 = reflect(iVar13,src_x,boundary_op);
            uVar2 = pCVar1->n;
            pCVar1->n = uVar2 + 1;
            *(short *)((long)&pCVar1->p->pixel + (ulong)((uint)uVar2 * 8)) = (short)iVar10;
            *(float *)((long)&pCVar1->p->weight + (ulong)((uint)uVar2 * 8)) = fVar21;
            fVar19 = fVar19 + fVar21;
            fVar4 = fVar21;
            uVar7 = (uint)uVar2;
            if (fVar21 <= fVar18) {
              fVar4 = fVar18;
              uVar7 = uVar11;
            }
          }
          fVar18 = fVar4;
          uVar11 = uVar7;
        }
        if ((uVar11 == 0xffffffff) || (pCVar1->n == 0)) goto LAB_00142134;
        if ((fVar19 != 1.0) || (NAN(fVar19))) {
          pCVar1->p[uVar11].weight = (1.0 - fVar19) + pCVar1->p[uVar11].weight;
        }
        local_78 = local_78 + (iVar5 + 1);
      }
      goto LAB_0014214a;
    }
  }
LAB_0014213e:
  crnlib_free(p);
  pCVar9 = (Contrib_List *)0x0;
LAB_0014214a:
  crnlib_free(pCVar12);
  return pCVar9;
LAB_00142134:
  crnlib_free(p_00);
  goto LAB_0014213e;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
    int src_x, int dst_x, Boundary_Op boundary_op,
    Resample_Real (*Pfilter)(Resample_Real),
    Resample_Real filter_support,
    Resample_Real filter_scale,
    Resample_Real src_ofs) {
  typedef struct
  {
    // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
    Resample_Real center;
    int left, right;
  } Contrib_Bounds;

  int i, j, k, n, left, right;
  Resample_Real total_weight;
  Resample_Real xscale, center, half_width, weight;
  Contrib_List* Pcontrib;
  Contrib* Pcpool;
  Contrib* Pcpool_next;
  Contrib_Bounds* Pcontrib_bounds;

  if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == NULL)
    return NULL;

  Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
  if (!Pcontrib_bounds) {
    crnlib_free(Pcontrib);
    return (NULL);
  }

  const Resample_Real oo_filter_scale = 1.0f / filter_scale;

  const Resample_Real NUDGE = 0.5f;
  xscale = dst_x / (Resample_Real)src_x;

  if (xscale < 1.0f) {
    int total;
    (void)total;

    /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

    // stretched half width of filter
    half_width = (filter_support / xscale) * filter_scale;

    // Find the range of source sample(s) that will contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }
    total = n;

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;

      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);
      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  } else {
    /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

    half_width = filter_support * filter_scale;

    // Find the source sample(s) that contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    int total = n;
    if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;
      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);

      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);

      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  }

#if RESAMPLER_DEBUG
  printf("*******\n");
#endif

  crnlib_free(Pcontrib_bounds);

  return Pcontrib;
}